

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int auxgetstr(lua_State *L,TValue *t,char *k)

{
  TValue *key;
  int iVar1;
  undefined4 uVar2;
  TString *key_00;
  TValue *slot;
  StkId pTVar3;
  
  key_00 = luaS_new(L,k);
  if (t->tt_ == 0x45) {
    slot = luaH_getstr((Table *)(t->value_).gc,key_00);
    if (slot->tt_ != 0) {
      pTVar3 = L->top;
      iVar1 = slot->tt_;
      uVar2 = *(undefined4 *)&slot->field_0xc;
      pTVar3->value_ = slot->value_;
      pTVar3->tt_ = iVar1;
      *(undefined4 *)&pTVar3->field_0xc = uVar2;
      pTVar3 = L->top + 1;
      L->top = pTVar3;
      goto LAB_00107c31;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  pTVar3 = L->top;
  (pTVar3->value_).gc = (GCObject *)key_00;
  pTVar3->tt_ = key_00->tt | 0x40;
  key = L->top;
  L->top = key + 1;
  luaV_finishget(L,t,key,key,slot);
  pTVar3 = L->top;
LAB_00107c31:
  return pTVar3[-1].tt_ & 0xf;
}

Assistant:

static int auxgetstr(lua_State *L, const TValue *t, const char *k) {
    const TValue *slot;
    TString *str = luaS_new(L, k);
    if (luaV_fastget(L, t, str, slot, luaH_getstr)) {
        setobj2s(L, L->top, slot);
        api_incr_top(L);
    } else {
        setsvalue2s(L, L->top, str);
        api_incr_top(L);
        luaV_finishget(L, t, L->top - 1, L->top - 1, slot);
    }
    lua_unlock(L);
    return ttnov(L->top - 1);
}